

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_suite.cpp
# Opt level: O2

void vector_suite::test_bool_empty(void)

{
  vector<bool,_std::allocator<bool>_> value;
  oarchive ar;
  ostringstream result;
  string local_230 [32];
  _Bvector_base<std::allocator<bool>_> local_210;
  basic_oarchive<char> local_1e8;
  ostringstream local_180 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  trial::protocol::json::basic_oarchive<char>::basic_oarchive<std::__cxx11::ostringstream>
            (&local_1e8,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  local_210._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  local_210._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  local_210._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  local_210._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  local_210._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  trial::protocol::json::basic_oarchive<char>::save_override<std::vector<bool,std::allocator<bool>>>
            (&local_1e8,(vector<bool,_std::allocator<bool>_> *)&local_210);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[3]>
            ("result.str()","\"[]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/oarchive_suite.cpp"
             ,0x19b,"void vector_suite::test_bool_empty()",local_230,"[]");
  std::__cxx11::string::~string(local_230);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_210);
  trial::protocol::json::basic_oarchive<char>::~basic_oarchive(&local_1e8);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void test_bool_empty()
{
    std::ostringstream result;
    json::oarchive ar(result);
    std::vector<bool> value;
    ar << value;
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "[]");
}